

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Transmitter_PDU::SetAntennaPattern(Transmitter_PDU *this,KOCTET *AP,KUINT16 Length)

{
  KUINT16 *pKVar1;
  pointer *ppcVar2;
  pointer pcVar3;
  pointer pcVar4;
  iterator __position;
  ushort uVar5;
  KUINT16 KVar6;
  char local_29;
  
  pcVar3 = (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar4 = (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + ((short)pcVar3 - (short)pcVar4);
  if (pcVar3 != pcVar4) {
    (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar3;
  }
  if (Length != 0) {
    KVar6 = Length;
    do {
      __position._M_current =
           (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                  ((vector<char,std::allocator<char>> *)&this->m_vAntennaPattern,__position,AP);
      }
      else {
        *__position._M_current = *AP;
        ppcVar2 = &(this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppcVar2 = *ppcVar2 + 1;
      }
      AP = AP + 1;
      KVar6 = KVar6 - 1;
    } while (KVar6 != 0);
    uVar5 = Length & 7;
    if (uVar5 != 0) {
      do {
        local_29 = '\0';
        std::vector<char,_std::allocator<char>_>::emplace_back<char>
                  (&this->m_vAntennaPattern,&local_29);
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  KVar6 = (short)*(undefined4 *)
                  &(this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl
                   .super__Vector_impl_data._M_finish -
          (short)*(undefined4 *)
                  &(this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl
                   .super__Vector_impl_data._M_start;
  this->m_ui16AntennaPatternLength = KVar6;
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + KVar6;
  return;
}

Assistant:

void Transmitter_PDU::SetAntennaPattern( const KOCTET * AP, KUINT16 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength -= m_vAntennaPattern.size();
    m_vAntennaPattern.clear();

    // Copy data into the vector
    for( KUINT16 i = 0; i < Length; ++i, ++AP )
    {
        m_vAntennaPattern.push_back( *AP );
    }

    // Check if we need to add any padding, the length should be a
    // multiple of 8.
    KUINT8 ui8PaddingNeeded = Length % 8;

    // Add the padding, if needed.
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vAntennaPattern.push_back( 0 );
    }

    // Update length
    m_ui16AntennaPatternLength = m_vAntennaPattern.size();
    m_ui16PDULength += m_ui16AntennaPatternLength;
}